

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<int,_int>::InnerLeaf<2>::InnerLeaf<1>(InnerLeaf<2> *this,InnerLeaf<1> *other)

{
  const_iterator __n;
  HighsHashTableEntry<int,_int> *__x;
  iterator __first;
  HighsHashTableEntry<int,_int> *in_RSI;
  HighsHashTableEntry<int,_int> *in_RDI;
  unsigned_long *in_stack_ffffffffffffffd0;
  unsigned_long *in_stack_ffffffffffffffe0;
  
  Occupation::Occupation((Occupation *)in_RDI);
  *in_RDI = *in_RSI;
  in_RDI[1].key_ = in_RSI[1].key_;
  __n = std::array<unsigned_long,_7UL>::cbegin((array<unsigned_long,_7UL> *)0x574656);
  std::array<unsigned_long,_7UL>::cbegin((array<unsigned_long,_7UL> *)0x574668);
  __x = (HighsHashTableEntry<int,_int> *)
        std::next<unsigned_long_const*>(in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<unsigned_long,_23UL>::begin((array<unsigned_long,_23UL> *)0x574691);
  std::copy<unsigned_long_const*,unsigned_long*>
            (in_stack_ffffffffffffffe0,(unsigned_long *)in_RDI,(unsigned_long *)__x);
  __first = std::array<HighsHashTableEntry<int,_int>,_6UL>::begin
                      ((array<HighsHashTableEntry<int,_int>,_6UL> *)0x5746b0);
  std::array<HighsHashTableEntry<int,_int>,_6UL>::begin
            ((array<HighsHashTableEntry<int,_int>,_6UL> *)0x5746c3);
  std::next<HighsHashTableEntry<int,int>*>(__x,(difference_type)__n);
  std::array<HighsHashTableEntry<int,_int>,_22UL>::begin
            ((array<HighsHashTableEntry<int,_int>,_22UL> *)0x5746ea);
  std::move<HighsHashTableEntry<int,int>*,HighsHashTableEntry<int,int>*>(__first,in_RDI,__x);
  return;
}

Assistant:

InnerLeaf(InnerLeaf<kOtherSize>&& other) {
      assert(other.size <= capacity());
      occupation = other.occupation;
      size = other.size;
      std::copy(other.hashes.cbegin(),
                std::next(other.hashes.cbegin(), size + 1), hashes.begin());
      std::move(other.entries.begin(), std::next(other.entries.begin(), size),
                entries.begin());
    }